

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scp.c
# Opt level: O3

LIBSSH2_CHANNEL * scp_recv(LIBSSH2_SESSION *session,char *path,libssh2_struct_stat *sb)

{
  uchar *puVar1;
  byte bVar2;
  libssh2_nonblocking_states lVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  uchar *puVar7;
  LIBSSH2_CHANNEL *channel;
  size_t sVar8;
  long lVar9;
  char *pcVar10;
  longlong lVar11;
  ssize_t sVar12;
  ulong uVar13;
  char *pcVar14;
  char *e;
  char *local_38;
  
  lVar3 = session->scpRecv_state;
  switch(lVar3) {
  case libssh2_NB_state_idle:
    break;
  default:
    if (lVar3 - libssh2_NB_state_sent2 < 2) goto LAB_0012187e;
    if (lVar3 == libssh2_NB_state_sent4) goto LAB_00121963;
    if ((lVar3 & ~libssh2_NB_state_allocated) == libssh2_NB_state_sent5) goto LAB_00121978;
    goto LAB_00121a4b;
  case libssh2_NB_state_created:
    goto switchD_00121623_caseD_2;
  case libssh2_NB_state_sent:
    channel = session->scpRecv_channel;
    goto LAB_00121794;
  case libssh2_NB_state_sent1:
    goto switchD_00121623_caseD_4;
  }
  session->scpRecv_mtime = 0;
  session->scpRecv_atime = 0;
  session->scpRecv_mode = 0;
  session->scpRecv_size = 0;
  sVar6 = strlen(path);
  sVar8 = (0xb - (ulong)(sb == (libssh2_struct_stat *)0x0)) + sVar6 * 3;
  session->scpRecv_command_len = sVar8;
  puVar7 = (uchar *)(*session->alloc)(sVar8,&session->abstract);
  session->scpRecv_command = puVar7;
  if (puVar7 == (uchar *)0x0) {
    pcVar14 = "Unable to allocate a command buffer for SCP session";
    iVar4 = -6;
    goto LAB_0012185f;
  }
  pcVar14 = "p";
  if (sb == (libssh2_struct_stat *)0x0) {
    pcVar14 = "";
  }
  snprintf((char *)puVar7,session->scpRecv_command_len,"scp -%sf ",pcVar14);
  puVar7 = session->scpRecv_command;
  sVar6 = strlen((char *)puVar7);
  if ((session->flag).quote_paths == 0) {
    sVar8 = strlen(path);
    memcpy(puVar7 + sVar6,path,sVar8);
  }
  else {
    sVar8 = shell_quotearg(path,puVar7 + sVar6,session->scpRecv_command_len - sVar6);
  }
  session->scpRecv_command_len = sVar8 + sVar6;
  session->scpRecv_state = libssh2_NB_state_created;
switchD_00121623_caseD_2:
  channel = _libssh2_channel_open(session,"session",7,0x200000,0x8000,(uchar *)0x0,0);
  session->scpRecv_channel = channel;
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    iVar4 = libssh2_session_last_errno(session);
    if (iVar4 != -0x25) {
      (*session->free)(session->scpRecv_command,&session->abstract);
      session->scpRecv_command = (uchar *)0x0;
      goto LAB_00121c6f;
    }
    pcVar14 = "Would block starting up channel";
    goto LAB_00121857;
  }
  session->scpRecv_state = libssh2_NB_state_sent;
LAB_00121794:
  iVar4 = _libssh2_channel_process_startup
                    (channel,"exec",4,(char *)session->scpRecv_command,session->scpRecv_command_len)
  ;
  if (iVar4 == 0) {
    (*session->free)(session->scpRecv_command,&session->abstract);
    session->scpRecv_command = (uchar *)0x0;
    session->scpRecv_response[0] = '\0';
    session->scpRecv_state = libssh2_NB_state_sent1;
switchD_00121623_caseD_4:
    sVar12 = _libssh2_channel_write(session->scpRecv_channel,0,session->scpRecv_response,1);
    if ((int)sVar12 == 1) {
      session->scpRecv_response_len = 0;
      session->scpRecv_state = libssh2_NB_state_sent2;
LAB_0012187e:
      if ((sb != (libssh2_struct_stat *)0x0) &&
         (uVar13 = session->scpRecv_response_len, uVar13 < 0x100)) {
        puVar7 = session->scpRecv_response;
        do {
          if (session->scpRecv_state == libssh2_NB_state_sent2) {
            sVar12 = _libssh2_channel_read(session->scpRecv_channel,0,(char *)(puVar7 + uVar13),1);
            iVar4 = (int)sVar12;
            if (iVar4 == -0x25) {
              pcVar14 = "Would block waiting for SCP response";
              goto LAB_00121857;
            }
            if (iVar4 < 0) goto LAB_00121b67;
            if (iVar4 == 0) goto LAB_00121b78;
            sVar8 = session->scpRecv_response_len;
            uVar13 = sVar8 + 1;
            session->scpRecv_response_len = uVar13;
            if (session->scpRecv_response[0] != 'T') {
              sVar8 = _libssh2_channel_packet_data_len(session->scpRecv_channel,0);
              pcVar14 = (char *)(*session->alloc)(sVar8 + 1,&session->abstract);
              if (pcVar14 != (char *)0x0) {
                _libssh2_channel_read(session->scpRecv_channel,0,pcVar14,sVar8);
                pcVar14[sVar8] = '\0';
                _libssh2_error(session,-0x1c,"Failed to recv file");
                (*session->free)(pcVar14,&session->abstract);
                goto LAB_00121c39;
              }
              pcVar14 = "Failed to get memory ";
              iVar4 = -6;
              goto LAB_00121c34;
            }
            if (1 < uVar13) {
              bVar2 = puVar7[sVar8];
              if (((byte)(bVar2 - 0x3a) < 0xf6) &&
                 ((0x20 < bVar2 || ((0x100002400U >> ((ulong)(uint)bVar2 & 0x3f) & 1) == 0))))
              goto LAB_00121c25;
              if (8 < uVar13) {
                if (bVar2 == 10) goto LAB_00121b16;
                if (uVar13 == 0x100) goto LAB_00121c0b;
              }
            }
          }
          else if (session->scpRecv_state == libssh2_NB_state_sent3) goto LAB_00121e6e;
        } while (uVar13 < 0x100);
      }
LAB_00121963:
      session->scpRecv_response_len = 0;
      session->scpRecv_state = libssh2_NB_state_sent5;
LAB_00121978:
      uVar13 = session->scpRecv_response_len;
      if (uVar13 < 0x100) {
        puVar7 = session->scpRecv_response;
        pcVar14 = "Would block waiting for SCP response";
        do {
          local_38 = (char *)0x0;
          if (session->scpRecv_state == libssh2_NB_state_sent5) {
            sVar12 = _libssh2_channel_read(session->scpRecv_channel,0,(char *)(puVar7 + uVar13),1);
            iVar4 = (int)sVar12;
            if (iVar4 == -0x25) goto LAB_00121e31;
            if (iVar4 < 0) goto LAB_00121b67;
            if (iVar4 == 0) goto LAB_00121b78;
            sVar8 = session->scpRecv_response_len;
            uVar13 = sVar8 + 1;
            session->scpRecv_response_len = uVar13;
            if (session->scpRecv_response[0] != 'C') {
              pcVar14 = "Invalid response from SCP server";
              goto LAB_00121c2c;
            }
            if (1 < uVar13) {
              bVar2 = puVar7[sVar8];
              if (((bVar2 != 10) && (bVar2 != 0xd)) && (bVar2 < 0x20)) goto LAB_00121c25;
              if (6 < uVar13) {
                if (bVar2 == 10) goto LAB_00121aab;
                if (uVar13 == 0x100) goto LAB_00121c0b;
              }
            }
          }
          else if (session->scpRecv_state == libssh2_NB_state_sent6) goto LAB_00121e01;
        } while (uVar13 < 0x100);
      }
LAB_00121a4b:
      if (sb != (libssh2_struct_stat *)0x0) {
        memset(sb,0,0x90);
        (sb->st_mtim).tv_sec = session->scpRecv_mtime;
        (sb->st_atim).tv_sec = session->scpRecv_atime;
        sb->st_size = session->scpRecv_size;
        sb->st_mode = (uint)(ushort)session->scpRecv_mode;
      }
      session->scpRecv_state = libssh2_NB_state_idle;
LAB_00121a95:
      return session->scpRecv_channel;
    }
    if ((int)sVar12 != -0x25) goto LAB_00121c39;
    pcVar14 = "Would block sending initial wakeup";
    goto LAB_00121857;
  }
  if (iVar4 == -0x25) {
    pcVar14 = "Would block requesting SCP startup";
    goto LAB_00121857;
  }
  (*session->free)(session->scpRecv_command,&session->abstract);
  session->scpRecv_command = (uchar *)0x0;
  goto LAB_00121c39;
LAB_00121b67:
  pcVar14 = "Failed reading SCP response";
  goto LAB_00121c34;
LAB_00121b78:
  iVar4 = libssh2_channel_eof(session->scpRecv_channel);
  if (iVar4 == 0) goto LAB_00121a95;
  pcVar14 = "Unexpected channel close";
  goto LAB_00121c2c;
LAB_00121c25:
  pcVar14 = "Invalid data in SCP response";
  goto LAB_00121c2c;
LAB_00121c0b:
  pcVar14 = "Unterminated response from SCP server";
  goto LAB_00121c2c;
LAB_00121b16:
  for (; (session->scpRecv_response[sVar8] == '\r' || (session->scpRecv_response[sVar8] == '\n'));
      sVar8 = sVar8 - 1) {
    session->scpRecv_response_len = sVar8;
  }
  session->scpRecv_response[sVar8 + 1] = '\0';
  if (session->scpRecv_response_len < 8) goto LAB_00121b3e;
  puVar1 = session->scpRecv_response + 1;
  pcVar14 = strchr((char *)puVar1,0x20);
  if (pcVar14 == (char *)0x0 || ((uchar *)pcVar14 == puVar1 || (long)pcVar14 - (long)puVar1 < 0)) {
    pcVar14 = "Invalid response from SCP server, malformed mtime";
    goto LAB_00121c2c;
  }
  pcVar10 = pcVar14 + 1;
  *pcVar14 = '\0';
  lVar9 = strtol((char *)puVar1,(char **)0x0,10);
  session->scpRecv_mtime = lVar9;
  pcVar14 = strchr(pcVar10,0x20);
  if (pcVar14 == (char *)0x0 || (pcVar14 == pcVar10 || (long)pcVar14 - (long)pcVar10 < 0)) {
    pcVar14 = "Invalid response from SCP server, malformed mtime.usec";
    goto LAB_00121c2c;
  }
  pcVar14 = pcVar14 + 1;
  pcVar10 = strchr(pcVar14,0x20);
  if (pcVar10 == (char *)0x0 || (pcVar10 == pcVar14 || (long)pcVar10 - (long)pcVar14 < 0))
  goto LAB_00121de4;
  *pcVar10 = '\0';
  lVar9 = strtol(pcVar14,(char **)0x0,10);
  session->scpRecv_atime = lVar9;
  session->scpRecv_response[0] = '\0';
  session->scpRecv_state = libssh2_NB_state_sent3;
LAB_00121e6e:
  sVar12 = _libssh2_channel_write(session->scpRecv_channel,0,puVar7,1);
  if ((int)sVar12 == 1) goto LAB_00121963;
  if ((int)sVar12 != -0x25) goto LAB_00121c39;
  pcVar14 = "Would block waiting to send SCP ACK";
LAB_00121857:
  iVar4 = -0x25;
LAB_0012185f:
  _libssh2_error(session,iVar4,pcVar14);
  return (LIBSSH2_CHANNEL *)0x0;
LAB_00121aab:
  for (; (session->scpRecv_response[sVar8] == '\r' || (session->scpRecv_response[sVar8] == '\n'));
      sVar8 = sVar8 - 1) {
    session->scpRecv_response_len = sVar8;
  }
  session->scpRecv_response[sVar8 + 1] = '\0';
  if (session->scpRecv_response_len < 6) {
LAB_00121b3e:
    pcVar14 = "Invalid response from SCP server, too short";
  }
  else {
    puVar1 = session->scpRecv_response + 1;
    pcVar14 = strchr((char *)puVar1,0x20);
    if (pcVar14 == (char *)0x0 || ((uchar *)pcVar14 == puVar1 || (long)pcVar14 - (long)puVar1 < 0))
    {
      pcVar14 = "Invalid response from SCP server, malformed mode";
    }
    else {
      *pcVar14 = '\0';
      lVar9 = strtol((char *)puVar1,&local_38,8);
      session->scpRecv_mode = lVar9;
      if ((local_38 == (char *)0x0) || (*local_38 == '\0')) {
        pcVar14 = pcVar14 + 1;
        pcVar10 = strchr(pcVar14,0x20);
        if ((pcVar10 == pcVar14 || (long)pcVar10 - (long)pcVar14 < 0) || pcVar10 == (char *)0x0) {
LAB_00121de4:
          pcVar14 = "Invalid response from SCP server, too short or malformed";
        }
        else {
          *pcVar10 = '\0';
          lVar11 = strtoll(pcVar14,&local_38,10);
          session->scpRecv_size = lVar11;
          if ((local_38 == (char *)0x0) || (*local_38 == '\0')) {
            session->scpRecv_response[0] = '\0';
            session->scpRecv_state = libssh2_NB_state_sent6;
LAB_00121e01:
            sVar12 = _libssh2_channel_write(session->scpRecv_channel,0,puVar7,1);
            if ((int)sVar12 == -0x25) {
              pcVar14 = "Would block sending SCP ACK";
LAB_00121e31:
              iVar4 = -0x25;
              goto LAB_0012185f;
            }
            if ((int)sVar12 != 1) goto LAB_00121c39;
            goto LAB_00121a4b;
          }
          pcVar14 = "Invalid response from SCP server, invalid size";
        }
      }
      else {
        pcVar14 = "Invalid response from SCP server, invalid mode";
      }
    }
  }
LAB_00121c2c:
  iVar4 = -0x1c;
LAB_00121c34:
  _libssh2_error(session,iVar4,pcVar14);
LAB_00121c39:
  iVar4 = session->err_code;
  pcVar14 = session->err_msg;
  do {
    iVar5 = libssh2_channel_free(session->scpRecv_channel);
  } while (iVar5 == -0x25);
  session->err_code = iVar4;
  session->err_msg = pcVar14;
  session->scpRecv_channel = (LIBSSH2_CHANNEL *)0x0;
LAB_00121c6f:
  session->scpRecv_state = libssh2_NB_state_idle;
  return (LIBSSH2_CHANNEL *)0x0;
}

Assistant:

static LIBSSH2_CHANNEL *
scp_recv(LIBSSH2_SESSION * session, const char *path, libssh2_struct_stat * sb)
{
    size_t cmd_len;
    int rc;
    int tmp_err_code;
    const char *tmp_err_msg;

    if(session->scpRecv_state == libssh2_NB_state_idle) {
        session->scpRecv_mode = 0;
        session->scpRecv_size = 0;
        session->scpRecv_mtime = 0;
        session->scpRecv_atime = 0;

        session->scpRecv_command_len =
            _libssh2_shell_quotedsize(path) + sizeof("scp -f ") + (sb ? 1 : 0);

        session->scpRecv_command =
            LIBSSH2_ALLOC(session, session->scpRecv_command_len);

        if(!session->scpRecv_command) {
            _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate a command buffer for "
                           "SCP session");
            return NULL;
        }

        snprintf((char *)session->scpRecv_command,
                 session->scpRecv_command_len,
                 "scp -%sf ", sb ? "p" : "");

        cmd_len = strlen((char *)session->scpRecv_command);

        if(!session->flag.quote_paths) {
            size_t path_len;

            path_len = strlen(path);

            /* no NUL-termination needed, so memcpy will do */
            memcpy(&session->scpRecv_command[cmd_len], path, path_len);
            cmd_len += path_len;
        }
        else {
            cmd_len += shell_quotearg(path,
                                      &session->scpRecv_command[cmd_len],
                                      session->scpRecv_command_len - cmd_len);
        }

        /* the command to exec should _not_ be NUL-terminated */
        session->scpRecv_command_len = cmd_len;

        _libssh2_debug((session, LIBSSH2_TRACE_SCP,
                       "Opening channel for SCP receive"));

        session->scpRecv_state = libssh2_NB_state_created;
    }

    if(session->scpRecv_state == libssh2_NB_state_created) {
        /* Allocate a channel */
        session->scpRecv_channel =
            _libssh2_channel_open(session, "session",
                                  sizeof("session") - 1,
                                  LIBSSH2_CHANNEL_WINDOW_DEFAULT,
                                  LIBSSH2_CHANNEL_PACKET_DEFAULT, NULL,
                                  0);
        if(!session->scpRecv_channel) {
            if(libssh2_session_last_errno(session) !=
                LIBSSH2_ERROR_EAGAIN) {
                LIBSSH2_FREE(session, session->scpRecv_command);
                session->scpRecv_command = NULL;
                session->scpRecv_state = libssh2_NB_state_idle;
            }
            else {
                _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                               "Would block starting up channel");
            }
            return NULL;
        }

        session->scpRecv_state = libssh2_NB_state_sent;
    }

    if(session->scpRecv_state == libssh2_NB_state_sent) {
        /* Request SCP for the desired file */
        rc = _libssh2_channel_process_startup(session->scpRecv_channel, "exec",
                                              sizeof("exec") - 1,
                                              (char *)session->scpRecv_command,
                                              session->scpRecv_command_len);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block requesting SCP startup");
            return NULL;
        }
        else if(rc) {
            LIBSSH2_FREE(session, session->scpRecv_command);
            session->scpRecv_command = NULL;
            goto scp_recv_error;
        }
        LIBSSH2_FREE(session, session->scpRecv_command);
        session->scpRecv_command = NULL;

        _libssh2_debug((session, LIBSSH2_TRACE_SCP, "Sending initial wakeup"));
        /* SCP ACK */
        session->scpRecv_response[0] = '\0';

        session->scpRecv_state = libssh2_NB_state_sent1;
    }

    if(session->scpRecv_state == libssh2_NB_state_sent1) {
        rc = (int)_libssh2_channel_write(session->scpRecv_channel, 0,
                                         session->scpRecv_response, 1);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                           "Would block sending initial wakeup");
            return NULL;
        }
        else if(rc != 1) {
            goto scp_recv_error;
        }

        /* Parse SCP response */
        session->scpRecv_response_len = 0;

        session->scpRecv_state = libssh2_NB_state_sent2;
    }

    if((session->scpRecv_state == libssh2_NB_state_sent2)
        || (session->scpRecv_state == libssh2_NB_state_sent3)) {
        while(sb && (session->scpRecv_response_len <
                     LIBSSH2_SCP_RESPONSE_BUFLEN)) {
            unsigned char *s, *p;

            if(session->scpRecv_state == libssh2_NB_state_sent2) {
                rc = (int)_libssh2_channel_read(session->scpRecv_channel, 0,
                                                (char *) session->
                                                scpRecv_response +
                                                session->scpRecv_response_len,
                                                1);
                if(rc == LIBSSH2_ERROR_EAGAIN) {
                    _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                                   "Would block waiting for SCP response");
                    return NULL;
                }
                else if(rc < 0) {
                    /* error, give up */
                    _libssh2_error(session, rc, "Failed reading SCP response");
                    goto scp_recv_error;
                }
                else if(rc == 0)
                    goto scp_recv_empty_channel;

                session->scpRecv_response_len++;

                if(session->scpRecv_response[0] != 'T') {
                    size_t err_len;
                    char *err_msg;

                    /* there can be
                       01 for warnings
                       02 for errors

                       The following string MUST be newline terminated
                    */
                    err_len =
                        _libssh2_channel_packet_data_len(session->
                                                         scpRecv_channel, 0);
                    err_msg = LIBSSH2_ALLOC(session, err_len + 1);
                    if(!err_msg) {
                        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                       "Failed to get memory ");
                        goto scp_recv_error;
                    }

                    /* Read the remote error message */
                    (void)_libssh2_channel_read(session->scpRecv_channel, 0,
                                                err_msg, err_len);
                    /* If it failed for any reason, we ignore it anyway. */

                    /* zero terminate the error */
                    err_msg[err_len] = 0;

                    _libssh2_debug((session, LIBSSH2_TRACE_SCP,
                                   "got %02x %s", session->scpRecv_response[0],
                                   err_msg));

                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Failed to recv file");

                    LIBSSH2_FREE(session, err_msg);
                    goto scp_recv_error;
                }

                if((session->scpRecv_response_len > 1) &&
                    ((session->
                      scpRecv_response[session->scpRecv_response_len - 1] <
                      '0')
                     || (session->
                         scpRecv_response[session->scpRecv_response_len - 1] >
                         '9'))
                    && (session->
                        scpRecv_response[session->scpRecv_response_len - 1] !=
                        ' ')
                    && (session->
                        scpRecv_response[session->scpRecv_response_len - 1] !=
                        '\r')
                    && (session->
                        scpRecv_response[session->scpRecv_response_len - 1] !=
                        '\n')) {
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid data in SCP response");
                    goto scp_recv_error;
                }

                if((session->scpRecv_response_len < 9)
                    || (session->
                        scpRecv_response[session->scpRecv_response_len - 1] !=
                        '\n')) {
                    if(session->scpRecv_response_len ==
                        LIBSSH2_SCP_RESPONSE_BUFLEN) {
                        /* You had your chance */
                        _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                       "Unterminated response from "
                                       "SCP server");
                        goto scp_recv_error;
                    }
                    /* Way too short to be an SCP response, or not done yet,
                       short circuit */
                    continue;
                }

                /* We're guaranteed not to go under response_len == 0 by the
                   logic above */
                while((session->
                        scpRecv_response[session->scpRecv_response_len - 1] ==
                        '\r')
                       || (session->
                           scpRecv_response[session->scpRecv_response_len -
                                            1] == '\n'))
                    session->scpRecv_response_len--;
                session->scpRecv_response[session->scpRecv_response_len] =
                    '\0';

                if(session->scpRecv_response_len < 8) {
                    /* EOL came too soon */
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, "
                                   "too short");
                    goto scp_recv_error;
                }

                s = session->scpRecv_response + 1;

                p = (unsigned char *) strchr((char *) s, ' ');
                if(!p || ((p - s) <= 0)) {
                    /* No spaces or space in the wrong spot */
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, "
                                   "malformed mtime");
                    goto scp_recv_error;
                }

                *(p++) = '\0';
                /* Make sure we don't get fooled by leftover values */
                session->scpRecv_mtime = strtol((char *) s, NULL, 10);

                s = (unsigned char *) strchr((char *) p, ' ');
                if(!s || ((s - p) <= 0)) {
                    /* No spaces or space in the wrong spot */
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, "
                                   "malformed mtime.usec");
                    goto scp_recv_error;
                }

                /* Ignore mtime.usec */
                s++;
                p = (unsigned char *) strchr((char *) s, ' ');
                if(!p || ((p - s) <= 0)) {
                    /* No spaces or space in the wrong spot */
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, "
                                   "too short or malformed");
                    goto scp_recv_error;
                }

                *p = '\0';
                /* Make sure we don't get fooled by leftover values */
                session->scpRecv_atime = strtol((char *) s, NULL, 10);

                /* SCP ACK */
                session->scpRecv_response[0] = '\0';

                session->scpRecv_state = libssh2_NB_state_sent3;
            }

            if(session->scpRecv_state == libssh2_NB_state_sent3) {
                rc = (int)_libssh2_channel_write(session->scpRecv_channel, 0,
                                                 session->scpRecv_response, 1);
                if(rc == LIBSSH2_ERROR_EAGAIN) {
                    _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                                   "Would block waiting to send SCP ACK");
                    return NULL;
                }
                else if(rc != 1) {
                    goto scp_recv_error;
                }

                _libssh2_debug((session, LIBSSH2_TRACE_SCP,
                               "mtime = %ld, atime = %ld",
                               session->scpRecv_mtime,
                               session->scpRecv_atime));

                /* We *should* check that atime.usec is valid, but why let
                   that stop use? */
                break;
            }
        }

        session->scpRecv_state = libssh2_NB_state_sent4;
    }

    if(session->scpRecv_state == libssh2_NB_state_sent4) {
        session->scpRecv_response_len = 0;

        session->scpRecv_state = libssh2_NB_state_sent5;
    }

    if((session->scpRecv_state == libssh2_NB_state_sent5)
        || (session->scpRecv_state == libssh2_NB_state_sent6)) {
        while(session->scpRecv_response_len < LIBSSH2_SCP_RESPONSE_BUFLEN) {
            char *s, *p, *e = NULL;

            if(session->scpRecv_state == libssh2_NB_state_sent5) {
                rc = (int)_libssh2_channel_read(session->scpRecv_channel, 0,
                                                (char *) session->
                                                scpRecv_response +
                                                session->scpRecv_response_len,
                                                1);
                if(rc == LIBSSH2_ERROR_EAGAIN) {
                    _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                                   "Would block waiting for SCP response");
                    return NULL;
                }
                else if(rc < 0) {
                    /* error, bail out */
                    _libssh2_error(session, rc, "Failed reading SCP response");
                    goto scp_recv_error;
                }
                else if(rc == 0)
                    goto scp_recv_empty_channel;

                session->scpRecv_response_len++;

                if(session->scpRecv_response[0] != 'C') {
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server");
                    goto scp_recv_error;
                }

                if((session->scpRecv_response_len > 1) &&
                    (session->
                     scpRecv_response[session->scpRecv_response_len - 1] !=
                     '\r')
                    && (session->
                        scpRecv_response[session->scpRecv_response_len - 1] !=
                        '\n')
                    &&
                    (session->
                     scpRecv_response[session->scpRecv_response_len - 1]
                     < 32)) {
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid data in SCP response");
                    goto scp_recv_error;
                }

                if((session->scpRecv_response_len < 7)
                    || (session->
                        scpRecv_response[session->scpRecv_response_len - 1] !=
                        '\n')) {
                    if(session->scpRecv_response_len ==
                        LIBSSH2_SCP_RESPONSE_BUFLEN) {
                        /* You had your chance */
                        _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                       "Unterminated response "
                                       "from SCP server");
                        goto scp_recv_error;
                    }
                    /* Way too short to be an SCP response, or not done yet,
                       short circuit */
                    continue;
                }

                /* We're guaranteed not to go under response_len == 0 by the
                   logic above */
                while((session->
                        scpRecv_response[session->scpRecv_response_len - 1] ==
                        '\r')
                       || (session->
                           scpRecv_response[session->scpRecv_response_len -
                                            1] == '\n')) {
                    session->scpRecv_response_len--;
                }
                session->scpRecv_response[session->scpRecv_response_len] =
                    '\0';

                if(session->scpRecv_response_len < 6) {
                    /* EOL came too soon */
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, "
                                   "too short");
                    goto scp_recv_error;
                }

                s = (char *) session->scpRecv_response + 1;

                p = strchr(s, ' ');
                if(!p || ((p - s) <= 0)) {
                    /* No spaces or space in the wrong spot */
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, "
                                   "malformed mode");
                    goto scp_recv_error;
                }

                *(p++) = '\0';
                /* Make sure we don't get fooled by leftover values */
                session->scpRecv_mode = strtol(s, &e, 8);
                if(e && *e) {
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, "
                                   "invalid mode");
                    goto scp_recv_error;
                }

                s = strchr(p, ' ');
                if(!s || ((s - p) <= 0)) {
                    /* No spaces or space in the wrong spot */
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, "
                                   "too short or malformed");
                    goto scp_recv_error;
                }

                *s = '\0';
                /* Make sure we don't get fooled by leftover values */
                session->scpRecv_size = scpsize_strtol(p, &e, 10);
                if(e && *e) {
                    _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                                   "Invalid response from SCP server, "
                                   "invalid size");
                    goto scp_recv_error;
                }

                /* SCP ACK */
                session->scpRecv_response[0] = '\0';

                session->scpRecv_state = libssh2_NB_state_sent6;
            }

            if(session->scpRecv_state == libssh2_NB_state_sent6) {
                rc = (int)_libssh2_channel_write(session->scpRecv_channel, 0,
                                                 session->scpRecv_response, 1);
                if(rc == LIBSSH2_ERROR_EAGAIN) {
                    _libssh2_error(session, LIBSSH2_ERROR_EAGAIN,
                                   "Would block sending SCP ACK");
                    return NULL;
                }
                else if(rc != 1) {
                    goto scp_recv_error;
                }
                _libssh2_debug((session, LIBSSH2_TRACE_SCP,
                               "mode = 0%lo size = %ld", session->scpRecv_mode,
                               (long)session->scpRecv_size));

                /* We *should* check that basename is valid, but why let that
                   stop us? */
                break;
            }
        }

        session->scpRecv_state = libssh2_NB_state_sent7;
    }

    if(sb) {
        memset(sb, 0, sizeof(libssh2_struct_stat));

        sb->st_mtime = session->scpRecv_mtime;
        sb->st_atime = session->scpRecv_atime;
        sb->st_size = (libssh2_struct_stat_size)session->scpRecv_size;
        sb->st_mode = (unsigned short)session->scpRecv_mode;
    }

    session->scpRecv_state = libssh2_NB_state_idle;
    return session->scpRecv_channel;

scp_recv_empty_channel:
    /* the code only jumps here as a result of a zero read from channel_read()
       so we check EOF status to avoid getting stuck in a loop */
    if(libssh2_channel_eof(session->scpRecv_channel))
        _libssh2_error(session, LIBSSH2_ERROR_SCP_PROTOCOL,
                       "Unexpected channel close");
    else
        return session->scpRecv_channel;
    /* fall-through */
scp_recv_error:
    tmp_err_code = session->err_code;
    tmp_err_msg = session->err_msg;
    while(libssh2_channel_free(session->scpRecv_channel) ==
           LIBSSH2_ERROR_EAGAIN);
    session->err_code = tmp_err_code;
    session->err_msg = tmp_err_msg;
    session->scpRecv_channel = NULL;
    session->scpRecv_state = libssh2_NB_state_idle;
    return NULL;
}